

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,char *type,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  int iVar1;
  reference pvVar2;
  layer_destroyer_func in_RCX;
  layer_creator_func in_RDX;
  char *in_RSI;
  long *in_RDI;
  void *in_R8;
  custom_layer_registry_entry entry;
  int custom_index;
  int typeindex;
  char *in_stack_ffffffffffffff78;
  value_type *in_stack_ffffffffffffff88;
  vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
  *in_stack_ffffffffffffff90;
  int local_4;
  
  iVar1 = layer_to_index(in_stack_ffffffffffffff78);
  if (iVar1 == -1) {
    iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
    if (iVar1 == -1) {
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      fprintf(_stderr,"overwrite existing custom layer type %s",in_RSI);
      fprintf(_stderr,"\n");
      pvVar2 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar1);
      pvVar2->name = in_RSI;
      pvVar2 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar1);
      pvVar2->creator = in_RDX;
      pvVar2 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar1);
      pvVar2->destroyer = in_RCX;
      pvVar2 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar1);
      pvVar2->userdata = in_R8;
    }
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"can not register build-in layer type %s",in_RSI);
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("can not register build-in layer type %s", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct custom_layer_registry_entry entry = {type, creator, destroyer, userdata};
        d->custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        d->custom_layer_registry[custom_index].name = type;
        d->custom_layer_registry[custom_index].creator = creator;
        d->custom_layer_registry[custom_index].destroyer = destroyer;
        d->custom_layer_registry[custom_index].userdata = userdata;
    }

    return 0;
}